

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_quad_brick_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined8 uVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  bool bVar17;
  REF_INT edg [3];
  REF_INT cell;
  REF_INT node;
  REF_INT quad [5];
  uint local_a0;
  uint local_9c;
  undefined4 local_98;
  REF_INT local_94;
  ulong local_90;
  double local_88;
  REF_GRID_conflict local_80;
  long local_78;
  ulong local_70;
  REF_DBL local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined4 local_48;
  ulong local_38;
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      uVar3 = dim - 1;
      local_88 = 1.0 / (double)(int)uVar3;
      local_78 = (long)dim;
      lVar16 = 0;
      local_38 = 0;
      if (0 < dim) {
        local_38 = (ulong)(uint)dim;
      }
      uVar9 = 0;
      local_90 = (ulong)(uint)dim;
      local_80 = pRVar1;
      while (pRVar1 = local_80, uVar9 != local_38) {
        local_68 = (double)(int)uVar9 * local_88 + 0.0;
        local_70 = uVar9;
        for (uVar14 = 0; (uint)dim != uVar14; uVar14 = uVar14 + 1) {
          uVar4 = ref_node_add(ref_node,lVar16 + uVar14,&local_5c);
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar15 = "node";
            uVar12 = 0x7bd;
            goto LAB_00123c10;
          }
          pRVar2 = ref_node->real;
          lVar11 = (long)local_5c;
          pRVar2[lVar11 * 0xf] = (double)(int)uVar14 * local_88 + 0.0;
          pRVar2[lVar11 * 0xf + 1] = local_68;
          pRVar2[lVar11 * 0xf + 2] = 0.0;
        }
        lVar16 = lVar16 + local_78;
        uVar9 = local_70 + 1;
      }
      local_98 = 1;
      local_88 = 0.0;
      if (0 < (int)uVar3) {
        local_88 = (double)(ulong)uVar3;
      }
      uVar4 = 0;
      do {
        if (local_88._0_4_ == uVar4) {
          local_98 = 2;
          iVar13 = local_88._0_4_ + 1;
          uVar4 = (int)local_90 * 2 - 1;
          uVar5 = uVar3;
          goto LAB_00123e27;
        }
        local_a0 = uVar4;
        local_9c = uVar4 + 1;
        uVar5 = ref_cell_add(pRVar1->cell[0],(REF_INT *)&local_a0,&local_94);
        uVar4 = uVar4 + 1;
      } while (uVar5 == 0);
      uVar9 = (ulong)uVar5;
      pcVar15 = "qua";
      uVar12 = 0x7c9;
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(ulong)(uint)(dim * dim));
      if (uVar3 == 0) {
        return 0;
      }
      uVar9 = (ulong)uVar3;
      pcVar15 = "init glob";
      uVar12 = 0x7ab;
    }
  }
  else {
    uVar9 = (ulong)uVar3;
    pcVar15 = "create";
    uVar12 = 0x7a4;
  }
  goto LAB_00123c10;
  while( true ) {
    local_a0 = uVar5;
    local_9c = uVar4;
    uVar6 = ref_cell_add(local_80->cell[0],(REF_INT *)&local_a0,&local_94);
    uVar4 = uVar4 + iVar8;
    uVar5 = uVar5 + iVar8;
    if (uVar6 != 0) break;
LAB_00123e27:
    iVar13 = iVar13 + -1;
    iVar8 = (int)local_90;
    if (iVar13 == 0) {
      local_98 = 3;
      local_68 = (REF_DBL)(ulong)(uint)(iVar8 * iVar8);
      uVar4 = iVar8 * iVar8 - 1;
      iVar13 = iVar8 + -2;
      goto LAB_00123eaa;
    }
  }
  uVar9 = (ulong)uVar6;
  pcVar15 = "edg";
  uVar12 = 0x7d1;
  goto LAB_00123c10;
  while( true ) {
    local_a0 = uVar4;
    local_9c = uVar4 - 1;
    uVar5 = ref_cell_add(local_80->cell[0],(REF_INT *)&local_a0,&local_94);
    iVar13 = iVar13 + -1;
    uVar4 = uVar4 - 1;
    if (uVar5 != 0) break;
LAB_00123eaa:
    if (iVar13 < 0) {
      local_98 = 4;
      uVar4 = uVar3;
      uVar5 = (int)local_90 * uVar3;
      uVar6 = (iVar8 + -2) * (int)local_90;
      goto LAB_00123f23;
    }
  }
  uVar9 = (ulong)uVar5;
  pcVar15 = "edg";
  uVar12 = 0x7d9;
  goto LAB_00123c10;
  while( true ) {
    local_a0 = uVar5;
    local_9c = uVar6;
    uVar7 = ref_cell_add(local_80->cell[0],(REF_INT *)&local_a0,&local_94);
    uVar5 = uVar5 - iVar13;
    uVar6 = uVar6 - iVar13;
    if (uVar7 != 0) break;
LAB_00123f23:
    uVar4 = uVar4 - 1;
    iVar13 = (int)local_90;
    if ((int)uVar4 < 0) {
      local_48 = 1;
      iVar8 = 0;
      iVar10 = 0;
      while (iVar10 != local_88._0_4_) {
        local_78 = CONCAT44(local_78._4_4_,iVar10 + 1);
        local_70 = CONCAT44(local_70._4_4_,iVar8);
        uVar4 = uVar3;
        while( true ) {
          bVar17 = uVar4 == 0;
          uVar4 = uVar4 - 1;
          if (bVar17) break;
          local_50 = iVar13 + 1 + iVar8;
          local_4c = iVar8 + (int)local_90;
          local_58 = iVar8;
          local_54 = iVar8 + 1;
          uVar5 = ref_cell_add(local_80->cell[6],&local_58,&local_94);
          uVar9 = (ulong)uVar5;
          iVar8 = iVar8 + 1;
          if (uVar5 != 0) {
            pcVar15 = "qua";
            uVar12 = 0x7ec;
            goto LAB_00123c10;
          }
        }
        iVar8 = (int)local_70 + (int)local_90;
        iVar10 = (int)local_78;
      }
      uVar3 = ref_node_initialize_n_global(ref_node,(REF_GLOB)local_68);
      if (uVar3 == 0) {
        return 0;
      }
      uVar9 = (ulong)uVar3;
      pcVar15 = "init glob";
      uVar12 = 0x7f0;
      goto LAB_00123c10;
    }
  }
  uVar9 = (ulong)uVar7;
  pcVar15 = "edg";
  uVar12 = 0x7e1;
LAB_00123c10:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar12,
         "ref_fixture_quad_brick_grid",uVar9,pcVar15);
  return (REF_STATUS)uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_quad_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], quad[5];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  quad[4] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      quad[0] = ij2node(i, j, m, n);
      quad[1] = ij2node(i + 1, j, m, n);
      quad[2] = ij2node(i + 1, j + 1, m, n);
      quad[3] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}